

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O1

Debug * Corrade::Utility::operator<<(Debug *debug,Type value)

{
  Debug *pDVar1;
  char *value_00;
  
  pDVar1 = Debug::operator<<(debug,"Utility::JsonToken::Type");
  (pDVar1->_immediateFlags)._value = (pDVar1->_immediateFlags)._value | 4;
  switch(value << 3 | (ulong)(value ^ Bool) >> 0x3d) {
  case 0:
    value_00 = "::Bool";
    break;
  case 1:
    value_00 = "::Number";
    break;
  case 2:
    value_00 = "::String";
    break;
  default:
    pDVar1 = Debug::operator<<(debug,"(");
    (pDVar1->_immediateFlags)._value = (pDVar1->_immediateFlags)._value | 0x84;
    debug = Debug::operator<<(pDVar1,value);
    (debug->_immediateFlags)._value = (debug->_immediateFlags)._value | 4;
    value_00 = ")";
    break;
  case 5:
    value_00 = "::Object";
    break;
  case 6:
    value_00 = "::Array";
    break;
  case 7:
    value_00 = "::Null";
  }
  pDVar1 = Debug::operator<<(debug,value_00);
  return pDVar1;
}

Assistant:

Debug& operator<<(Debug& debug, const JsonToken::Type value) {
    debug << "Utility::JsonToken::Type" << Debug::nospace;

    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(v) case JsonToken::Type::v: return debug << "::" #v;
        _c(Object)
        _c(Array)
        _c(Null)
        _c(Bool)
        _c(Number)
        _c(String)
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "(" << Debug::nospace << Debug::hex << std::uint64_t(value) << Debug::nospace << ")";
}